

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# childgenerator.cpp
# Opt level: O3

string * __thiscall
ChildGenerator::generateCode_abi_cxx11_(string *__return_storage_ptr__,ChildGenerator *this)

{
  int fieldIndex;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0 < this->numFields_) {
    fieldIndex = 0;
    do {
      handleFieldGeneration_abi_cxx11_(&local_50,this,fieldIndex);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      fieldIndex = fieldIndex + 1;
    } while (fieldIndex < this->numFields_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ChildGenerator::generateCode() {
  std::string code;

  for(int i = 0; i < numFields_; i++) {
    code += handleFieldGeneration(i);
  }

  return code;
}